

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O1

void __thiscall sc_core::sc_signal_channel::notify_next_delta(sc_signal_channel *this,sc_event *ev)

{
  pointer *pppsVar1;
  sc_simcontext *psVar2;
  iterator __position;
  sc_event *local_18;
  
  if (ev != (sc_event *)0x0) {
    if (ev->m_notify_type != NONE) {
      sc_report_handler::report
                (SC_ERROR,
                 "notify_delayed() cannot be called on events that have pending notifications",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_event.h"
                 ,0x1b6);
    }
    psVar2 = ev->m_simc;
    __position._M_current =
         (psVar2->m_delta_events).
         super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (psVar2->m_delta_events).
        super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_18 = ev;
      std::vector<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>::_M_realloc_insert
                (&psVar2->m_delta_events,__position,&local_18);
    }
    else {
      *__position._M_current = ev;
      pppsVar1 = &(psVar2->m_delta_events).
                  super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppsVar1 = *pppsVar1 + 1;
    }
    ev->m_delta_event_index =
         (int)((ulong)((long)(psVar2->m_delta_events).
                             super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(psVar2->m_delta_events).
                            super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    ev->m_notify_type = DELTA;
  }
  return;
}

Assistant:

void notify_next_delta( sc_event* ev ) const
        { if( ev ) ev->notify_next_delta(); }